

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O3

MPP_RET mpp_buffer_mmap(MppBufferImpl *buffer,char *caller)

{
  MPP_RET MVar1;
  
  if (((byte)mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","enter\n","mpp_buffer_mmap");
  }
  MVar1 = (*buffer->alloc_api->mmap)(buffer->allocator,&buffer->info);
  if (MVar1 != MPP_OK) {
    _mpp_log_l(2,"mpp_buffer","buffer %d group %d fd %d map failed caller %s\n","mpp_buffer_mmap",
               (ulong)(uint)buffer->buffer_id,(ulong)buffer->group_id,(ulong)(uint)(buffer->info).fd
               ,caller);
  }
  buf_add_log(buffer,BUF_MMAP,caller);
  if (((byte)mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","leave\n","mpp_buffer_mmap");
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_buffer_mmap(MppBufferImpl *buffer, const char* caller)
{
    MPP_BUF_FUNCTION_ENTER();

    MPP_RET ret = buffer->alloc_api->mmap(buffer->allocator, &buffer->info);
    if (ret)
        mpp_err_f("buffer %d group %d fd %d map failed caller %s\n",
                  buffer->buffer_id, buffer->group_id, buffer->info.fd, caller);

    buf_add_log(buffer, BUF_MMAP, caller);

    MPP_BUF_FUNCTION_LEAVE();
    return ret;
}